

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

int parseNumber(string *str,int begin,int end)

{
  int iVar1;
  _Alloc_hider __nptr;
  int *piVar2;
  long lVar3;
  runtime_error *prVar4;
  long *plVar5;
  long *plVar6;
  string s;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
  __nptr._M_p = local_50._M_dataplus._M_p;
  if ((end <= begin) || (9 < (int)(str->_M_dataplus)._M_p[begin] - 0x30U)) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_70,"expected the entire string ",&local_50);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = (long *)*plVar5;
    plVar6 = plVar5 + 2;
    if (local_90 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(prVar4,(string *)&local_90);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr._M_p,(char **)&local_90,10);
  if (local_90 == (long *)__nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if ((long)local_90 - (long)__nptr._M_p == (long)(end - begin)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return (int)lVar3;
    }
    goto LAB_00168c7b;
  }
  std::__throw_out_of_range("stoi");
LAB_00168c7b:
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"expected the entire string ",&local_50);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90 = (long *)*plVar5;
  plVar6 = plVar5 + 2;
  if (local_90 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(prVar4,(string *)&local_90);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int parseNumber(const std::string &str, int begin, int end)
{
  std::string s { str.substr(begin, end-begin) };
  if ((begin < end) and isdigit(str[begin])) {
    //    std::cout << "found number at: " << begin << " and " << end << std::endl;
    size_t lastloc;
    int a = std::stoi(s, &lastloc, 10); // Not correct yet:  "23(a+b)" return val will be 2
    if (lastloc != end-begin)
      throw std::runtime_error("expected the entire string " + s + " to be a number");
    return a;
  }
  throw std::runtime_error("expected the entire string " + s + " to be a number");
}